

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v10::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  allocator_type *paVar1;
  size_t sVar2;
  allocator_type *paVar3;
  buffer<unsigned_int> *__p;
  pointer __result;
  allocator_type *in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *new_data;
  uint *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  size_type in_stack_ffffffffffffffa8;
  allocator_type *in_stack_ffffffffffffffb0;
  buffer<unsigned_int> *__n;
  allocator_type *__first;
  
  v10::detail::abort_fuzzing_if(false);
  paVar1 = (allocator_type *)
           std::allocator_traits<std::allocator<unsigned_int>_>::max_size
                     ((allocator_type *)0x1c6410);
  sVar2 = v10::detail::buffer<unsigned_int>::capacity(in_RDI);
  paVar3 = (allocator_type *)(sVar2 + (sVar2 >> 1));
  __first = in_RSI;
  if (((in_RSI <= paVar3) && (__first = paVar3, paVar1 < paVar3)) &&
     (in_stack_ffffffffffffffb0 = paVar1, __first = paVar1, paVar1 < in_RSI)) {
    in_stack_ffffffffffffffb0 = in_RSI;
    __first = in_RSI;
  }
  __p = (buffer<unsigned_int> *)v10::detail::buffer<unsigned_int>::data(in_RDI);
  __result = std::allocator_traits<std::allocator<unsigned_int>_>::allocate
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  v10::detail::buffer<unsigned_int>::size(in_RDI);
  __n = __p;
  v10::detail::buffer<unsigned_int>::size(in_RDI);
  std::uninitialized_copy_n<unsigned_int*,unsigned_long,unsigned_int*>
            ((uint *)__first,(unsigned_long)__n,__result);
  v10::detail::buffer<unsigned_int>::set(in_RDI,__result,(size_t)__first);
  if (__n != in_RDI + 1) {
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)in_stack_ffffffffffffffb0,(uint *)__p,0x1c6533);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t size) override {
    detail::abort_fuzzing_if(size > 5000);
    const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
    size_t old_capacity = this->capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = size > max_size ? size : max_size;
    T* old_data = this->data();
    T* new_data =
        std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(this->size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    std::uninitialized_copy_n(old_data, this->size(), new_data);
    this->set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
  }